

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,char *value)

{
  char *pcVar1;
  char *value_local;
  Value *this_local;
  
  initBasic(this,stringValue,true);
  pcVar1 = duplicateStringValue(value,0xffffffff);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const char* value) {
  initBasic(stringValue, true);
  value_.string_ = duplicateStringValue(value);
}